

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  int iVar2;
  longlong lVar3;
  ostream *poVar4;
  char *__assertion;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  Array b;
  QPDFObjectHandle c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8 [2];
  Array a;
  QPDF pdf2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  bool local_6a;
  allocator_type local_69;
  QPDFObjectHandle d;
  QPDF pdf;
  shared_ptr<QPDFObject> obj;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  QPDF local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_e8._M_allocated_capacity = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (element_type *)0x0;
  b.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 1
  ;
  QPDFObject::create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
            ((QPDFObject *)&obj,
             (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f8,(bool *)&b);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f8);
  qpdf::Array::Array(&a,&obj);
  iVar2 = qpdf::Array::size(&a);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,"1",(allocator<char> *)&d)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"",(allocator<char> *)&pdf2);
    QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
    qpdf::Array::push_back(&a,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"(potato)",(allocator<char> *)&d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"",(allocator<char> *)&pdf2);
    QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
    qpdf::Array::push_back(&a,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"null",(allocator<char> *)&d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"",(allocator<char> *)&pdf2);
    QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
    qpdf::Array::push_back(&a,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"null",(allocator<char> *)&d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"",(allocator<char> *)&pdf2);
    QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
    qpdf::Array::push_back(&a,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"/Quack",(allocator<char> *)&d);
    std::__cxx11::string::string<std::allocator<char>>((string *)&b,"",(allocator<char> *)&pdf2);
    QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
    qpdf::Array::push_back(&a,&c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&c.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::~string((string *)local_f8);
    iVar2 = qpdf::Array::size(&a);
    if (iVar2 == 5) {
      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_f8,&a,0);
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_f8 + 8));
      if (bVar1) {
        qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,0);
        lVar3 = QPDFObjectHandle::getIntValue
                          ((QPDFObjectHandle *)
                           &b.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        if (lVar3 == 1) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b.sp_elements);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_allocated_capacity);
          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,1);
          bVar1 = QPDFObjectHandle::isString
                            ((QPDFObjectHandle *)
                             &b.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
          if (bVar1) {
            qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,1);
            QPDFObjectHandle::getStringValue_abi_cxx11_
                      ((string *)local_f8,
                       (QPDFObjectHandle *)
                       &c.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_f8,"potato");
            if (bVar1) {
              std::__cxx11::string::~string((string *)local_f8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b.sp_elements);
              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_f8,&a,2);
              bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_f8 + 8));
              if (bVar1) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &local_e8._M_allocated_capacity);
                qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_f8,&a,3);
                bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_f8 + 8));
                if (bVar1) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_e8._M_allocated_capacity);
                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,4);
                  bVar1 = QPDFObjectHandle::isName
                                    ((QPDFObjectHandle *)
                                     &b.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
                  if (bVar1) {
                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,4);
                    QPDFObjectHandle::getName_abi_cxx11_
                              ((string *)local_f8,
                               (QPDFObjectHandle *)
                               &c.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_f8,"/Quack");
                    if (bVar1) {
                      std::__cxx11::string::~string((string *)local_f8);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a8);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b.sp_elements);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_f8,"/BeforeQuack",(allocator<char> *)&d);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&b,"",(allocator<char> *)&pdf2);
                      QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
                      qpdf::Array::insert(&a,4,&c);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&c.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::__cxx11::string::~string((string *)&b);
                      std::__cxx11::string::~string((string *)local_f8);
                      iVar2 = qpdf::Array::size(&a);
                      if (iVar2 != 6) {
                        __assertion = "a.size() == 6";
                        __line = 0x1e;
                        goto LAB_0011cb73;
                      }
                      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_f8,&a,0);
                      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_f8 + 8));
                      if (bVar1) {
                        qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,0);
                        lVar3 = QPDFObjectHandle::getIntValue
                                          ((QPDFObjectHandle *)
                                           &b.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                        if (lVar3 == 1) {
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b.sp_elements);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     &local_e8._M_allocated_capacity);
                          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,4);
                          bVar1 = QPDFObjectHandle::isName
                                            ((QPDFObjectHandle *)
                                             &b.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                          if (bVar1) {
                            qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,4);
                            QPDFObjectHandle::getName_abi_cxx11_
                                      ((string *)local_f8,
                                       (QPDFObjectHandle *)
                                       &c.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount);
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/BeforeQuack");
                            if (bVar1) {
                              std::__cxx11::string::~string((string *)local_f8);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (local_a8);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                         &b.sp_elements);
                              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,5);
                              bVar1 = QPDFObjectHandle::isName
                                                ((QPDFObjectHandle *)
                                                 &b.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                              if (bVar1) {
                                qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,5);
                                QPDFObjectHandle::getName_abi_cxx11_
                                          ((string *)local_f8,
                                           (QPDFObjectHandle *)
                                           &c.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Quack");
                                if (bVar1) {
                                  std::__cxx11::string::~string((string *)local_f8);
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                            (local_a8);
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             &b.sp_elements);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)local_f8,"/Third",(allocator<char> *)&d);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&b,"",(allocator<char> *)&pdf2);
                                  QPDFObjectHandle::parse(&c,(string *)local_f8,(string *)&b);
                                  qpdf::Array::insert(&a,2,&c);
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                            (&c.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                                  std::__cxx11::string::~string((string *)&b);
                                  std::__cxx11::string::~string((string *)local_f8);
                                  iVar2 = qpdf::Array::size(&a);
                                  if (iVar2 != 7) {
                                    __assertion = "a.size() == 7";
                                    __line = 0x24;
                                    goto LAB_0011cb73;
                                  }
                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,1);
                                  bVar1 = QPDFObjectHandle::isString
                                                    ((QPDFObjectHandle *)
                                                     &b.super_BaseHandle.obj.
                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                  if (bVar1) {
                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,1);
                                    QPDFObjectHandle::getStringValue_abi_cxx11_
                                              ((string *)local_f8,
                                               (QPDFObjectHandle *)
                                               &c.super_BaseHandle.obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"potato");
                                    if (bVar1) {
                                      std::__cxx11::string::~string((string *)local_f8);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count(local_a8);
                                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                      ~__shared_count((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                      &b.sp_elements);
                                      qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,2);
                                      bVar1 = QPDFObjectHandle::isName
                                                        ((QPDFObjectHandle *)
                                                         &b.super_BaseHandle.obj.
                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                      if (bVar1) {
                                        qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,2);
                                        QPDFObjectHandle::getName_abi_cxx11_
                                                  ((string *)local_f8,
                                                   (QPDFObjectHandle *)
                                                   &c.super_BaseHandle.obj.
                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Third");
                                        if (bVar1) {
                                          std::__cxx11::string::~string((string *)local_f8);
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count(local_a8);
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)local_f8,
                                                          &a,3);
                                          bVar1 = QPDFObjectHandle::isNull
                                                            ((QPDFObjectHandle *)(local_f8 + 8));
                                          if (!bVar1) {
                                            __assertion = "a.at(3).second.isNull()";
                                            __line = 0x27;
                                            goto LAB_0011cb73;
                                          }
                                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                          ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                          qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,6);
                                          bVar1 = QPDFObjectHandle::isName
                                                            ((QPDFObjectHandle *)
                                                             &b.super_BaseHandle.obj.
                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                          if (bVar1) {
                                            qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,&a,6)
                                            ;
                                            QPDFObjectHandle::getName_abi_cxx11_
                                                      ((string *)local_f8,
                                                       (QPDFObjectHandle *)
                                                       &c.super_BaseHandle.obj.
                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Quack");
                                            if (bVar1) {
                                              std::__cxx11::string::~string((string *)local_f8);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count(local_a8);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)local_f8,"/First",
                                                         (allocator<char> *)&d);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&b,"",(allocator<char> *)&pdf2);
                                              QPDFObjectHandle::parse
                                                        (&c,(string *)local_f8,(string *)&b);
                                              qpdf::Array::insert(&a,0,&c);
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              ~__shared_count(&c.super_BaseHandle.obj.
                                                                                                                              
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                              std::__cxx11::string::~string((string *)&b);
                                              std::__cxx11::string::~string((string *)local_f8);
                                              iVar2 = qpdf::Array::size(&a);
                                              if (iVar2 != 8) {
                                                __assertion = "a.size() == 8";
                                                __line = 0x2b;
                                                goto LAB_0011cb73;
                                              }
                                              qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b,&a,
                                                              0);
                                              bVar1 = QPDFObjectHandle::isName
                                                                ((QPDFObjectHandle *)
                                                                 &b.super_BaseHandle.obj.
                                                                                                                                    
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                              if (bVar1) {
                                                qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&c,
                                                                &a,0);
                                                QPDFObjectHandle::getName_abi_cxx11_
                                                          ((string *)local_f8,
                                                           (QPDFObjectHandle *)
                                                           &c.super_BaseHandle.obj.
                                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                if (bVar1) {
                                                  std::__cxx11::string::~string((string *)local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(local_a8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,7);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,7);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Quack");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::erase(&a,6);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  if (iVar2 != 7) {
                                                    __assertion = "a.size() == 7";
                                                    __line = 0x31;
                                                    goto LAB_0011cb73;
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,0);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,5);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (!bVar1) {
                                                    __assertion = "a.at(5).second.isNull()";
                                                    __line = 0x34;
                                                    goto LAB_0011cb73;
                                                  }
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,6);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,6);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Quack");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::erase(&a,6);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  if (iVar2 != 6) {
                                                    __assertion = "a.size() == 6";
                                                    __line = 0x38;
                                                    goto LAB_0011cb73;
                                                  }
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,0);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,3);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Third");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,4);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,5);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)local_f8,"12",
                                                             (allocator<char> *)&d);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&b,"",
                                                             (allocator<char> *)&pdf2);
                                                  QPDFObjectHandle::parse
                                                            (&c,(string *)local_f8,(string *)&b);
                                                  qpdf::Array::setAt(&a,4,&c);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&c.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__cxx11::string::~string((string *)&b);
                                                  std::__cxx11::string::~string((string *)local_f8);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,4);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,4);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 0xc) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  QPDFObjectHandle::newNull();
                                                  qpdf::Array::setAt(&a,4,(QPDFObjectHandle *)
                                                                          local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,4);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  qpdf::Array::erase(&a,iVar2 + -1);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  if (iVar2 == 5) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,0);
                                                    bVar1 = QPDFObjectHandle::isName
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,3);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Third");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,4);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  qpdf::Array::erase(&a,iVar2 + -1);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  if (iVar2 == 4) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,0);
                                                    bVar1 = QPDFObjectHandle::isName
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,3);
                                                  bVar1 = QPDFObjectHandle::isName
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,3);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/Third");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  qpdf::Array::erase(&a,iVar2 + -1);
                                                  iVar2 = qpdf::Array::size(&a);
                                                  if (iVar2 == 3) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,0);
                                                    bVar1 = QPDFObjectHandle::isName
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,0);
                                                    QPDFObjectHandle::getName_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"/First");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&a,1);
                                                  bVar1 = QPDFObjectHandle::isInteger
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &b,&a,1);
                                                    lVar3 = QPDFObjectHandle::getIntValue
                                                                      ((QPDFObjectHandle *)
                                                                       &b.super_BaseHandle.obj.
                                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (lVar3 == 1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&b
                                                                  ,&a,2);
                                                  bVar1 = QPDFObjectHandle::isString
                                                                    ((QPDFObjectHandle *)
                                                                     &b.super_BaseHandle.obj.
                                                                                                                                            
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  if (bVar1) {
                                                    qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                    &c,&a,2);
                                                    QPDFObjectHandle::getStringValue_abi_cxx11_
                                                              ((string *)local_f8,
                                                               (QPDFObjectHandle *)
                                                               &c.super_BaseHandle.obj.
                                                                                                                                
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,"potato");
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(local_a8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &b.sp_elements);
                                                  QPDF::QPDF(&pdf);
                                                  QPDF::emptyPDF(&pdf);
                                                  operator____qpdf((char *)&pdf2,0x22c893);
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&d,(
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&pdf2);
                                                  c.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = d.super_BaseHandle.obj.
                                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                                  c.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount = d.super_BaseHandle.obj.
                                                                                                                                  
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount;
                                                  d.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  d.super_BaseHandle.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi =
                                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)0x0;
                                                  std::
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  ::vector((
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_f8,10,&c,&local_69);
                                                  local_6a = true;
                                                  QPDFObject::
                                                  create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                                                            ((QPDFObject *)&b,
                                                             (
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_f8,&local_6a);
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::operator=(&obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ,(
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&b);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&b.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  ::~vector((
                                                  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                                  *)local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&c.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&d.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_78);
                                                  qpdf::Array::Array(&b,(shared_ptr<QPDFObject> *)
                                                                        &obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                                  QPDF::newIndirectNull((QPDF *)local_f8);
                                                  qpdf::Array::setAt(&b,5,(QPDFObjectHandle *)
                                                                          local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  operator____qpdf(local_f8,0x20e4c6);
                                                  qpdf::Array::setAt(&b,7,(QPDFObjectHandle *)
                                                                          local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&b,3);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&b,8);
                                                  bVar1 = QPDFObjectHandle::isNull
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&b,5);
                                                  bVar1 = QPDFObjectHandle::isIndirect
                                                                    ((QPDFObjectHandle *)
                                                                     (local_f8 + 8));
                                                  if (bVar1) {
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)&c,&obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                                  QPDFObjectHandle::unparse_abi_cxx11_
                                                            ((string *)local_f8,&c);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,
                                                  "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]"
                                                  );
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count(&c.super_BaseHandle.obj.
                                                                                                                                              
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_f8,
                                                  &obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                                  QPDFObjectHandle::unsafeShallowCopy(&c);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr((
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_f8,
                                                  &obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                                  QPDFObjectHandle::shallowCopy(&d);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)
                                                                  local_f8,&b,7);
                                                  operator____qpdf((char *)&pdf2,0x20e5bd);
                                                  QPDFObjectHandle::setArrayItem
                                                            ((QPDFObjectHandle *)(local_f8 + 8),2,
                                                             (QPDFObjectHandle *)&pdf2);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_78);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  &local_e8._M_allocated_capacity);
                                                  QPDFObjectHandle::unparse_abi_cxx11_
                                                            ((string *)local_f8,&c);
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,
                                                  "[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]"
                                                  );
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    QPDFObjectHandle::unparse_abi_cxx11_
                                                              ((string *)local_f8,&d);
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f8,
                                                  "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]"
                                                  );
                                                  if (bVar1) {
                                                    std::__cxx11::string::~string
                                                              ((string *)local_f8);
                                                    local_f8._0_8_ = (pointer)0x0;
                                                    local_f8._8_8_ = (element_type *)0x0;
                                                    qpdf::Array::setAt(&b,3,(QPDFObjectHandle *)
                                                                            local_f8);
                                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                    ::~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "inserted uninitialized object\n")
                                                  ;
                                                  QPDF::QPDF(&pdf2);
                                                  QPDF::emptyPDF(&pdf2);
                                                  std::
                                                  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ::__shared_ptr(&local_38,
                                                                 &obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  );
                                                  QPDF::makeIndirectObject
                                                            (&local_28,(QPDFObjectHandle *)&pdf);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_20);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&local_38._M_refcount);
                                                  QPDF::getObject((QPDF *)local_f8,(int)&pdf2,1);
                                                  qpdf::Array::setAt(&b,3,(QPDFObjectHandle *)
                                                                          local_f8);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count((
                                                  __shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                                  (local_f8 + 8));
                                                  std::operator<<((ostream *)&std::cout,
                                                                  "inserted uninitialized object\n")
                                                  ;
                                                  poVar4 = std::operator<<((ostream *)&std::cout,
                                                                           "sparse array tests done"
                                                                          );
                                                  std::endl<char,std::char_traits<char>>(poVar4);
                                                  QPDF::~QPDF(&pdf2);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&d.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&c.super_BaseHandle.obj.
                                                                                                                                      
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  qpdf::Array::~Array(&b);
                                                  QPDF::~QPDF(&pdf);
                                                  qpdf::Array::~Array(&a);
                                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                                  ~__shared_count(&obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                                  return 0;
                                                  }
                                                  __assertion = 
                                                  "d.unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                                                  ;
                                                  __line = 0x69;
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "c.unparse() == \"[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]\""
                                                  ;
                                                  __line = 0x68;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "QPDFObjectHandle(obj).unparse() == \"[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]\""
                                                  ;
                                                  __line = 100;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "b.at(5).second.isIndirect()";
                                                    __line = 0x61;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "b.at(8).second.isNull()";
                                                    __line = 0x60;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "b.at(3).second.isNull()";
                                                    __line = 0x5f;
                                                  }
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(2).second.isString() && (a.at(2).second.getStringValue() == \"potato\")"
                                                  ;
                                                  __line = 0x55;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x54;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ;
                                                  __line = 0x53;
                                                  }
                                                  else {
                                                    __assertion = "a.size() == 3";
                                                    __line = 0x52;
                                                  }
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ;
                                                  __line = 0x4f;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x4e;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ;
                                                  __line = 0x4d;
                                                  }
                                                  else {
                                                    __assertion = "a.size() == 4";
                                                    __line = 0x4c;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "a.at(4).second.isNull()";
                                                    __line = 0x49;
                                                  }
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ;
                                                  __line = 0x48;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x47;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ;
                                                  __line = 0x46;
                                                  }
                                                  else {
                                                    __assertion = "a.size() == 5";
                                                    __line = 0x45;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "a.at(4).second.isNull()";
                                                    __line = 0x42;
                                                  }
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12)"
                                                  ;
                                                  __line = 0x40;
                                                  }
                                                  else {
                                                    __assertion = "a.at(5).second.isNull()";
                                                    __line = 0x3d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "a.at(4).second.isNull()";
                                                    __line = 0x3c;
                                                  }
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(3).second.isName() && (a.at(3).second.getName() == \"/Third\")"
                                                  ;
                                                  __line = 0x3b;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x3a;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ;
                                                  __line = 0x39;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")"
                                                  ;
                                                  __line = 0x35;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x33;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                                  ;
                                                  __line = 0x32;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(7).second.isName() && (a.at(7).second.getName() == \"/Quack\")"
                                                  ;
                                                  __line = 0x2e;
                                                  goto LAB_0011cb73;
                                                  }
                                                  }
                                                  __assertion = 
                                                  "a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1)"
                                                  ;
                                                  __line = 0x2d;
                                                  goto LAB_0011cb73;
                                                }
                                              }
                                              __assertion = 
                                              "a.at(0).second.isName() && (a.at(0).second.getName() == \"/First\")"
                                              ;
                                              __line = 0x2c;
                                              goto LAB_0011cb73;
                                            }
                                          }
                                          __assertion = 
                                          "a.at(6).second.isName() && (a.at(6).second.getName() == \"/Quack\")"
                                          ;
                                          __line = 0x28;
                                          goto LAB_0011cb73;
                                        }
                                      }
                                      __assertion = 
                                      "a.at(2).second.isName() && (a.at(2).second.getName() == \"/Third\")"
                                      ;
                                      __line = 0x26;
                                      goto LAB_0011cb73;
                                    }
                                  }
                                  __assertion = 
                                  "a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")"
                                  ;
                                  __line = 0x25;
                                  goto LAB_0011cb73;
                                }
                              }
                              __assertion = 
                              "a.at(5).second.isName() && (a.at(5).second.getName() == \"/Quack\")";
                              __line = 0x21;
                              goto LAB_0011cb73;
                            }
                          }
                          __assertion = 
                          "a.at(4).second.isName() && (a.at(4).second.getName() == \"/BeforeQuack\")"
                          ;
                          __line = 0x20;
                          goto LAB_0011cb73;
                        }
                      }
                      __assertion = 
                      "a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)";
                      __line = 0x1f;
                      goto LAB_0011cb73;
                    }
                  }
                  __assertion = 
                  "a.at(4).second.isName() && (a.at(4).second.getName() == \"/Quack\")";
                  __line = 0x1b;
                }
                else {
                  __assertion = "a.at(3).second.isNull()";
                  __line = 0x1a;
                }
              }
              else {
                __assertion = "a.at(2).second.isNull()";
                __line = 0x19;
              }
              goto LAB_0011cb73;
            }
          }
          __assertion = 
          "a.at(1).second.isString() && (a.at(1).second.getStringValue() == \"potato\")";
          __line = 0x18;
          goto LAB_0011cb73;
        }
      }
      __assertion = "a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1)";
      __line = 0x17;
    }
    else {
      __assertion = "a.size() == 5";
      __line = 0x16;
    }
  }
  else {
    __assertion = "a.size() == 0";
    __line = 0xf;
  }
LAB_0011cb73:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/sparse_array.cc"
                ,__line,"int main()");
}

Assistant:

int
main()
{
    auto obj = QPDFObject::create<QPDF_Array>(std::vector<QPDFObjectHandle>(), true);
    auto a = qpdf::Array(obj);

    assert(a.size() == 0);

    a.push_back(QPDFObjectHandle::parse("1"));
    a.push_back(QPDFObjectHandle::parse("(potato)"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("null"));
    a.push_back(QPDFObjectHandle::parse("/Quack"));
    assert(a.size() == 5);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isNull());
    assert(a.at(3).second.isNull());
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/Quack"));

    a.insert(4, QPDFObjectHandle::parse("/BeforeQuack"));
    assert(a.size() == 6);
    assert(a.at(0).second.isInteger() && (a.at(0).second.getIntValue() == 1));
    assert(a.at(4).second.isName() && (a.at(4).second.getName() == "/BeforeQuack"));
    assert(a.at(5).second.isName() && (a.at(5).second.getName() == "/Quack"));

    a.insert(2, QPDFObjectHandle::parse("/Third"));
    assert(a.size() == 7);
    assert(a.at(1).second.isString() && (a.at(1).second.getStringValue() == "potato"));
    assert(a.at(2).second.isName() && (a.at(2).second.getName() == "/Third"));
    assert(a.at(3).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.insert(0, QPDFObjectHandle::parse("/First"));
    assert(a.size() == 8);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(7).second.isName() && (a.at(7).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 7);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(5).second.isNull());
    assert(a.at(6).second.isName() && (a.at(6).second.getName() == "/Quack"));

    a.erase(6);
    assert(a.size() == 6);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());
    assert(a.at(5).second.isNull());

    a.setAt(4, QPDFObjectHandle::parse("12"));
    assert(a.at(4).second.isInteger() && (a.at(4).second.getIntValue() == 12));
    a.setAt(4, QPDFObjectHandle::newNull());
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 5);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));
    assert(a.at(4).second.isNull());

    a.erase(a.size() - 1);
    assert(a.size() == 4);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(3).second.isName() && (a.at(3).second.getName() == "/Third"));

    a.erase(a.size() - 1);
    assert(a.size() == 3);
    assert(a.at(0).second.isName() && (a.at(0).second.getName() == "/First"));
    assert(a.at(1).second.isInteger() && (a.at(1).second.getIntValue() == 1));
    assert(a.at(2).second.isString() && (a.at(2).second.getStringValue() == "potato"));

    QPDF pdf;
    pdf.emptyPDF();

    obj = QPDFObject::create<QPDF_Array>(
        std::vector<QPDFObjectHandle>{10, "null"_qpdf.getObj()}, true);
    auto b = qpdf::Array(obj);
    b.setAt(5, pdf.newIndirectNull());
    b.setAt(7, "[0 1 2 3]"_qpdf);
    assert(b.at(3).second.isNull());
    assert(b.at(8).second.isNull());
    assert(b.at(5).second.isIndirect());
    assert(
        QPDFObjectHandle(obj).unparse() ==
        "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");
    auto c = QPDFObjectHandle(obj).unsafeShallowCopy();
    auto d = QPDFObjectHandle(obj).shallowCopy();
    b.at(7).second.setArrayItem(2, "42"_qpdf);
    assert(c.unparse() == "[ null null null null null 3 0 R null [ 0 1 42 3 ] null null ]");
    assert(d.unparse() == "[ null null null null null 3 0 R null [ 0 1 2 3 ] null null ]");

    try {
        b.setAt(3, {});
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }
    QPDF pdf2;
    pdf2.emptyPDF();
    try {
        pdf.makeIndirectObject(obj);
        b.setAt(3, pdf2.getObject(1, 0));
        std::cout << "inserted uninitialized object\n";
    } catch (std::logic_error&) {
    }

    std::cout << "sparse array tests done" << std::endl;
    return 0;
}